

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.h
# Opt level: O3

void __thiscall
Clasp::Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
          (PrgDepGraph *this,BodyNode *n,AddReasonLit *p)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  NodeId id;
  Literal p_00;
  uint *puVar4;
  ulong uVar5;
  
  uVar1 = *(uint *)&(n->super_Node).field_0x4;
  id = 0;
  puVar4 = (n->super_Node).sep_;
  uVar3 = *puVar4;
  uVar5 = (ulong)(((uVar1 >> 0x1d & 1) != 0) + 1);
  if (uVar3 != 0xffffffff) {
    id = 0;
    do {
      DefaultUnfoundedCheck::AddReasonLit::operator()
                (p,(Literal)(this->atoms_).ebo_.buf[uVar3].super_Node.lit.rep_,id,false);
      id = id + 1;
      uVar3 = puVar4[uVar5];
      puVar4 = puVar4 + uVar5;
    } while (uVar3 != 0xffffffff);
    uVar1 = *(uint *)&(n->super_Node).field_0x4;
  }
  uVar2 = (ulong)(uVar1 >> 0x1c & 1);
  p_00.rep_ = puVar4[uVar2];
  if (p_00.rep_ != 0xffffffff) {
    puVar4 = puVar4 + uVar5 + uVar2;
    do {
      DefaultUnfoundedCheck::AddReasonLit::operator()(p,p_00,id,true);
      id = id + 1;
      p_00.rep_ = *puVar4;
      puVar4 = puVar4 + uVar5;
    } while (p_00.rep_ != 0xffffffff);
  }
  return;
}

Assistant:

void visitBodyLiterals(const BodyNode& n, const P& p) const {
		const NodeId*  x = n.preds();
		const uint32 inc = n.pred_inc();
		uint32         i = 0;
		for (; *x != idMax; x += inc, ++i) { p(getAtom(*x).lit, i, false); }
		x += n.extended();
		for (; *x != idMax; x += inc, ++i) { p(Literal::fromRep(*x), i, true); }
	}